

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeWeakMapPrototype
               (DynamicObject *weakMapPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  uint uVar3;
  JavascriptString *pJVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,weakMapPrototype,mode,6,0);
  this = (((weakMapPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(weakMapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (weakMapPrototype,0x67,(this->super_JavascriptLibraryBase).weakMapConstructor.ptr,6,0,0,
             uVar4);
  AddFunctionToLibraryObject
            (this,weakMapPrototype,0x6f,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Delete,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,weakMapPrototype,0x198,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Get,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this,weakMapPrototype,0xb4,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Has,1,'\x06');
  AddFunctionToLibraryObject
            (this,weakMapPrototype,0x19b,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Set,2,'\x06')
  ;
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar2 = CreateStringFromCppLiteral<8ul>(this,(char16 (*) [8])L"WeakMap");
    (*(weakMapPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (weakMapPrototype,0x1b,pJVar2,2,0,0,uVar4 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(weakMapPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakMapPrototype(DynamicObject* weakMapPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakMapPrototype, mode, 6);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakMap
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = weakMapPrototype->GetScriptContext();
        JavascriptLibrary* library = weakMapPrototype->GetLibrary();
        library->AddMember(weakMapPrototype, PropertyIds::constructor, library->weakMapConstructor);

        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::delete_, &JavascriptWeakMap::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::get, &JavascriptWeakMap::EntryInfo::Get, 1);
        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::has, &JavascriptWeakMap::EntryInfo::Has, 1);
        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::set, &JavascriptWeakMap::EntryInfo::Set, 2);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(weakMapPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WeakMap")), PropertyConfigurable);
        }

        weakMapPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }